

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_message.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::cpp::MessageGenerator::GenerateDefaultInstanceInitializer
          (MessageGenerator *this,Printer *printer)

{
  bool bVar1;
  int iVar2;
  CppType CVar3;
  OneofDescriptor *pOVar4;
  FileDescriptor *pFVar5;
  FieldOptions *this_00;
  FieldDescriptor *pFVar6;
  FieldGenerator *pFVar7;
  FieldDescriptor *extraout_RDX;
  FieldDescriptor *extraout_RDX_00;
  FieldDescriptor *field_00;
  string local_118;
  string local_f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  undefined1 local_48 [8];
  string name;
  FieldDescriptor *field;
  int i;
  Printer *printer_local;
  MessageGenerator *this_local;
  
  bVar1 = IsMapEntryMessage(this->descriptor_);
  if (bVar1) {
    io::Printer::Print(printer,
                       "_$classname$_default_instance_.get_mutable()->set_default_instance(_$classname$_default_instance_.get_mutable());\n_$classname$_default_instance_.get_mutable()->InitAsDefaultInstance();\n"
                       ,"classname",&this->classname_);
  }
  else {
    for (field._4_4_ = 0; iVar2 = Descriptor::field_count(this->descriptor_), field._4_4_ < iVar2;
        field._4_4_ = field._4_4_ + 1) {
      name.field_2._8_8_ = Descriptor::field(this->descriptor_,field._4_4_);
      bVar1 = FieldDescriptor::is_repeated((FieldDescriptor *)name.field_2._8_8_);
      if ((bVar1) ||
         (CVar3 = FieldDescriptor::cpp_type((FieldDescriptor *)name.field_2._8_8_),
         CVar3 != CPPTYPE_MESSAGE)) {
LAB_003ef338:
        pOVar4 = FieldDescriptor::containing_oneof((FieldDescriptor *)name.field_2._8_8_);
        if (pOVar4 != (OneofDescriptor *)0x0) {
          pFVar5 = Descriptor::file(this->descriptor_);
          bVar1 = HasDescriptorMethods(pFVar5,&this->options_);
          if (bVar1) {
            pFVar6 = Descriptor::field(this->descriptor_,field._4_4_);
            pFVar7 = FieldGeneratorMap::get(&this->field_generators_,pFVar6);
            (*pFVar7->_vptr_FieldGenerator[0xe])(pFVar7,printer);
          }
        }
      }
      else {
        pOVar4 = FieldDescriptor::containing_oneof((FieldDescriptor *)name.field_2._8_8_);
        if (pOVar4 != (OneofDescriptor *)0x0) {
          pFVar5 = Descriptor::file(this->descriptor_);
          bVar1 = HasDescriptorMethods(pFVar5,&this->options_);
          if (!bVar1) goto LAB_003ef338;
        }
        std::__cxx11::string::string((string *)local_48);
        pOVar4 = FieldDescriptor::containing_oneof((FieldDescriptor *)name.field_2._8_8_);
        if (pOVar4 == (OneofDescriptor *)0x0) {
          this_00 = FieldDescriptor::options((FieldDescriptor *)name.field_2._8_8_);
          bVar1 = FieldOptions::weak(this_00);
          if (bVar1) goto LAB_003ef152;
          std::operator+(&local_d8,"_",&this->classname_);
          std::operator+(&local_b8,&local_d8,"_default_instance_.get_mutable()->");
          std::__cxx11::string::operator=((string *)local_48,(string *)&local_b8);
          std::__cxx11::string::~string((string *)&local_b8);
          std::__cxx11::string::~string((string *)&local_d8);
          pFVar6 = extraout_RDX_00;
        }
        else {
LAB_003ef152:
          std::operator+(&local_98,"_",&this->classname_);
          std::operator+(&local_78,&local_98,"_default_instance_.");
          std::__cxx11::string::operator=((string *)local_48,(string *)&local_78);
          std::__cxx11::string::~string((string *)&local_78);
          std::__cxx11::string::~string((string *)&local_98);
          pFVar6 = extraout_RDX;
        }
        FieldName_abi_cxx11_(&local_f8,(cpp *)name.field_2._8_8_,pFVar6);
        std::__cxx11::string::operator+=((string *)local_48,(string *)&local_f8);
        std::__cxx11::string::~string((string *)&local_f8);
        FieldMessageTypeName_abi_cxx11_(&local_118,(cpp *)name.field_2._8_8_,field_00);
        io::Printer::Print(printer,
                           "$name$_ = const_cast< $type$*>(\n    $type$::internal_default_instance());\n"
                           ,"name",(string *)local_48,"type",&local_118);
        std::__cxx11::string::~string((string *)&local_118);
        std::__cxx11::string::~string((string *)local_48);
      }
    }
  }
  return;
}

Assistant:

void MessageGenerator::
GenerateDefaultInstanceInitializer(io::Printer* printer) {
  if (IsMapEntryMessage(descriptor_)) {
    printer->Print(
        "_$classname$_default_instance_.get_mutable()->set_default_instance(_$"
        "classname$_default_instance_.get_mutable());\n"
        "_$classname$_default_instance_.get_mutable()->InitAsDefaultInstance();"
        "\n",
        "classname", classname_);
    return;
  }

  // The default instance needs all of its embedded message pointers
  // cross-linked to other default instances.  We can't do this initialization
  // in the constructor because some other default instances may not have been
  // constructed yet at that time.
  // TODO(kenton):  Maybe all message fields (even for non-default messages)
  //   should be initialized to point at default instances rather than NULL?
  for (int i = 0; i < descriptor_->field_count(); i++) {
    const FieldDescriptor* field = descriptor_->field(i);

    if (!field->is_repeated() &&
        field->cpp_type() == FieldDescriptor::CPPTYPE_MESSAGE &&
        (field->containing_oneof() == NULL ||
         HasDescriptorMethods(descriptor_->file(), options_))) {
      string name;
      if (field->containing_oneof() || field->options().weak()) {
        name = "_" + classname_ + "_default_instance_.";
      } else {
        name = "_" + classname_ + "_default_instance_.get_mutable()->";
      }
      name += FieldName(field);
      printer->Print(
          "$name$_ = const_cast< $type$*>(\n"
          "    $type$::internal_default_instance());\n",
          // Vars.
          "name", name, "type", FieldMessageTypeName(field));
    } else if (field->containing_oneof() &&
               HasDescriptorMethods(descriptor_->file(), options_)) {
      field_generators_.get(descriptor_->field(i))
          .GenerateConstructorCode(printer);
    }
  }
}